

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputedValues.h
# Opt level: O2

void __thiscall Rml::Style::RareValues::RareValues(RareValues *this)

{
  *(uint *)this = *(uint *)this & 0xe000c000 | 0xf0;
  (this->clip).value = '\0';
  this->min_width = 0.0;
  this->max_width = 3.4028235e+38;
  this->min_height = 0.0;
  this->max_height = 3.4028235e+38;
  this->vertical_align_length = 0.0;
  this->perspective = 0.0;
  this->perspective_origin_x = 50.0;
  this->perspective_origin_y = 50.0;
  this->transform_origin_x = 50.0;
  this->transform_origin_y = 50.0;
  this->border_top_left_radius = 0;
  this->border_top_right_radius = 0;
  this->border_bottom_right_radius = 0;
  this->border_bottom_left_radius = 0;
  this->transform_origin_z = 0.0;
  this->flex_basis = 0.0;
  this->row_gap = 0.0;
  this->column_gap = 0.0;
  (this->image_color).red = 0xff;
  (this->image_color).green = 0xff;
  (this->image_color).blue = 0xff;
  (this->image_color).alpha = 0xff;
  this->scrollbar_margin = 0.0;
  return;
}

Assistant:

RareValues() :
			min_width_type(LengthPercentage::Length), max_width_type(LengthPercentage::Length), min_height_type(LengthPercentage::Length),
			max_height_type(LengthPercentage::Length),

			perspective_origin_x_type(LengthPercentage::Percentage), perspective_origin_y_type(LengthPercentage::Percentage),
			transform_origin_x_type(LengthPercentage::Percentage), transform_origin_y_type(LengthPercentage::Percentage), has_local_transform(false),
			has_local_perspective(false),

			flex_basis_type(LengthPercentageAuto::Auto), row_gap_type(LengthPercentage::Length), column_gap_type(LengthPercentage::Length),

			vertical_align_type(VerticalAlign::Baseline), drag(Drag::None), tab_index(TabIndex::None), overscroll_behavior(OverscrollBehavior::Auto),

			has_mask_image(false), has_filter(false), has_backdrop_filter(false), has_box_shadow(false)
		{}